

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int ON_Material::CompareNameAndIds(ON_Material *a,ON_Material *b)

{
  int iVar1;
  int iVar2;
  ON_UUID *pOVar3;
  wchar_t *other_string;
  long lVar4;
  ulong uVar5;
  ON_UUID bid;
  ON_UUID aid;
  undefined1 auStack_68 [16];
  ON_UUID local_58;
  ON_UUID local_48;
  
  pOVar3 = ON_ModelComponent::Id(&a->super_ON_ModelComponent);
  local_48.Data1 = pOVar3->Data1;
  local_48.Data2 = pOVar3->Data2;
  local_48.Data3 = pOVar3->Data3;
  local_48.Data4 = *&pOVar3->Data4;
  pOVar3 = ON_ModelComponent::Id(&b->super_ON_ModelComponent);
  local_58.Data1 = pOVar3->Data1;
  local_58.Data2 = pOVar3->Data2;
  local_58.Data3 = pOVar3->Data3;
  local_58.Data4 = *&pOVar3->Data4;
  iVar2 = ON_UuidCompare(&local_48,&local_58);
  if (iVar2 == 0) {
    ON_ModelComponent::Name((ON_ModelComponent *)(auStack_68 + 8));
    ON_ModelComponent::Name((ON_ModelComponent *)auStack_68);
    other_string = ON_wString::operator_cast_to_wchar_t_((ON_wString *)auStack_68);
    iVar2 = ON_wString::CompareOrdinal((ON_wString *)(auStack_68 + 8),other_string,false);
    ON_wString::~ON_wString((ON_wString *)auStack_68);
    ON_wString::~ON_wString((ON_wString *)(auStack_68 + 8));
    if ((iVar2 == 0) &&
       (iVar2 = ON_UuidCompare(&a->m_rdk_material_instance_id,&b->m_rdk_material_instance_id),
       iVar2 == 0)) {
      iVar1 = (a->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
      iVar2 = iVar1 - (b->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
      if (iVar2 == 0 && 0 < (long)iVar1) {
        lVar4 = 0x10;
        uVar5 = 1;
        do {
          iVar2 = ON_UuidCompare((ON_UUID *)
                                 ((long)&((ON_Texture *)
                                         (&((ON_Texture *)
                                           (&((ON_Texture *)
                                             (&((a->m_textures).super_ON_ClassArray<ON_Texture>.m_a)
                                               ->m_texture_id + -1))->m_texture_id + -1))->
                                           m_texture_id + -1))->m_texture_id +
                                 lVar4 + 0xfffffffffffffff0U),
                                 (ON_UUID *)
                                 ((long)&((ON_Texture *)
                                         (&((ON_Texture *)
                                           (&((ON_Texture *)
                                             (&((b->m_textures).super_ON_ClassArray<ON_Texture>.m_a)
                                               ->m_texture_id + -1))->m_texture_id + -1))->
                                           m_texture_id + -1))->m_texture_id +
                                 lVar4 + 0xfffffffffffffff0U));
          if ((ulong)(long)iVar1 <= uVar5) {
            return iVar2;
          }
          lVar4 = lVar4 + 0x200;
          uVar5 = uVar5 + 1;
        } while (iVar2 == 0);
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_Material::CompareNameAndIds( const ON_Material& a, const ON_Material& b )
{
  // do NOT test index or id

  const ON_UUID aid = a.Id();
  const ON_UUID bid = b.Id();
  int rc = ON_UuidCompare( &aid, &bid );
  if (rc) return rc;

  rc = a.Name().CompareOrdinal( static_cast< const wchar_t* >(b.Name()), false );
  if (rc) return rc;

  rc = ON_UuidCompare(&a.m_rdk_material_instance_id, &b.m_rdk_material_instance_id);
  if (rc) return rc;

  const int tcount = a.m_textures.Count();
  rc = tcount - b.m_textures.Count();
  for (int i = 0; i < tcount && 0 == rc; i++)
  {
    rc = ON_UuidCompare(a.m_textures[i].m_texture_id, b.m_textures[i].m_texture_id);
  }

  return rc;
}